

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

void stbiw__writefv(stbi__write_context *s,char *fmt,__va_list_tag *v)

{
  char cVar1;
  uint uVar2;
  undefined8 in_RAX;
  undefined1 *puVar3;
  undefined2 *puVar4;
  undefined4 *puVar5;
  undefined1 uStack_38;
  uchar x;
  uchar b [2];
  uchar b_1 [4];
  
  _uStack_38 = in_RAX;
  while( true ) {
    while( true ) {
      while( true ) {
        do {
          cVar1 = *fmt;
          if (cVar1 == '\0') {
            return;
          }
          fmt = fmt + 1;
        } while (cVar1 == ' ');
        if (cVar1 != '4') break;
        uVar2 = v->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar5 = (undefined4 *)((ulong)uVar2 + (long)v->reg_save_area);
          v->gp_offset = uVar2 + 8;
        }
        else {
          puVar5 = (undefined4 *)v->overflow_arg_area;
          v->overflow_arg_area = puVar5 + 2;
        }
        _uStack_38 = CONCAT44(*puVar5,_uStack_38);
        (*s->func)(s->context,b_1,4);
      }
      if (cVar1 != '2') break;
      uVar2 = v->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar4 = (undefined2 *)((ulong)uVar2 + (long)v->reg_save_area);
        v->gp_offset = uVar2 + 8;
      }
      else {
        puVar4 = (undefined2 *)v->overflow_arg_area;
        v->overflow_arg_area = puVar4 + 4;
      }
      _uStack_38 = CONCAT22(*puVar4,_uStack_38);
      (*s->func)(s->context,b,2);
    }
    if (cVar1 != '1') break;
    uVar2 = v->gp_offset;
    if ((ulong)uVar2 < 0x29) {
      puVar3 = (undefined1 *)((ulong)uVar2 + (long)v->reg_save_area);
      v->gp_offset = uVar2 + 8;
    }
    else {
      puVar3 = (undefined1 *)v->overflow_arg_area;
      v->overflow_arg_area = puVar3 + 8;
    }
    _uStack_38 = CONCAT11(*puVar3,uStack_38);
    (*s->func)(s->context,&x,1);
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/stb/stb_image_write.h"
                ,0x144,"void stbiw__writefv(stbi__write_context *, const char *, __va_list_tag *)");
}

Assistant:

static void stbiw__writefv(stbi__write_context *s, const char *fmt, va_list v)
{
   while (*fmt) {
      switch (*fmt++) {
         case ' ': break;
         case '1': { unsigned char x = STBIW_UCHAR(va_arg(v, int));
                     s->func(s->context,&x,1);
                     break; }
         case '2': { int x = va_arg(v,int);
                     unsigned char b[2];
                     b[0] = STBIW_UCHAR(x);
                     b[1] = STBIW_UCHAR(x>>8);
                     s->func(s->context,b,2);
                     break; }
         case '4': { stbiw_uint32 x = va_arg(v,int);
                     unsigned char b[4];
                     b[0]=STBIW_UCHAR(x);
                     b[1]=STBIW_UCHAR(x>>8);
                     b[2]=STBIW_UCHAR(x>>16);
                     b[3]=STBIW_UCHAR(x>>24);
                     s->func(s->context,b,4);
                     break; }
         default:
            STBIW_ASSERT(0);
            return;
      }
   }
}